

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stack.hpp
# Opt level: O1

void __thiscall
Lib::
Stack<std::tuple<Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::IntegerConstantType>_>
::~Stack(Stack<std::tuple<Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::IntegerConstantType>_>
         *this)

{
  __mpz_struct *p_Var1;
  ulong uVar2;
  __mpz_struct *r;
  
  r = (__mpz_struct *)this->_cursor;
  while (p_Var1 = (__mpz_struct *)this->_stack, r != p_Var1) {
    mpz_clear(r + -2);
    mpz_clear(r + -3);
    r = r + -4;
    mpz_clear(r);
  }
  if (p_Var1 != (__mpz_struct *)0x0) {
    uVar2 = this->_capacity << 6;
    if (uVar2 == 0) {
      p_Var1->_mp_alloc = GLOBAL_SMALL_OBJECT_ALLOCATOR._16_4_;
      p_Var1->_mp_size = GLOBAL_SMALL_OBJECT_ALLOCATOR._20_4_;
      GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = p_Var1;
    }
    else {
      if (0x40 < uVar2) {
        operator_delete(p_Var1,0x10);
        return;
      }
      p_Var1->_mp_alloc = GLOBAL_SMALL_OBJECT_ALLOCATOR._136_4_;
      p_Var1->_mp_size = GLOBAL_SMALL_OBJECT_ALLOCATOR._140_4_;
      GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = p_Var1;
    }
  }
  return;
}

Assistant:

inline ~Stack()
  {
    //The while cycle is completely eliminated by compiler
    //in "-O6 -DVDEBUG=0" mode for types without destructor,
    //so this destructor is constant time.
    C* p=_cursor;
    while(p!=_stack) {
      (--p)->~C();
    }
    if(_stack) {
      DEALLOC_KNOWN(_stack,_capacity*sizeof(C),className());
    }
    else {
      ASS_EQ(_capacity,0);
    }
  }